

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O1

void process_una(NMQ *q,uint32_t una)

{
  dlist_s *pdVar1;
  dlist_s *pdVar2;
  int8_t iVar3;
  dlist_s **ppdVar4;
  
  pdVar1 = (q->snd_buf).next;
  while ((pdVar1 != &q->snd_buf && (pdVar2 = pdVar1 + 2, *(uint *)&pdVar2->next < una))) {
    pdVar1 = pdVar1->next;
    process_ack(q,*(uint *)&pdVar2->next,0);
  }
  iVar3 = list_not_empty(&q->snd_buf);
  if (iVar3 == '\0') {
    ppdVar4 = (dlist_s **)&q->snd_nxt;
  }
  else {
    ppdVar4 = &(q->snd_buf).next[2].next;
  }
  q->snd_una = *(uint32_t *)ppdVar4;
  return;
}

Assistant:

static void process_una(NMQ *q, uint32_t una) {
    dlnode *node = 0, *nxt = 0;
    FOR_EACH(node, nxt, &q->snd_buf) {
        segment *s = ADDRESS_FOR(segment, head, node);
        if (s->sn < una) {
            process_ack(q, s->sn, 0);
        } else {
            break;
        }
    }

    update_una(q);
}